

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MS3DLoader.cpp
# Opt level: O0

void __thiscall
Assimp::MS3DImporter::InternReadFile
          (MS3DImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  allocator<unsigned_int> *this_00;
  double *pdVar1;
  value_type vVar2;
  float fVar3;
  long lVar4;
  aiVertexWeight aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined8 __s;
  int8_t iVar11;
  bool bVar12;
  int16_t iVar13;
  int iVar14;
  uint uVar15;
  int32_t iVar16;
  IOStream *stream_00;
  DeadlyImportError *pDVar17;
  reference pos_00;
  reference pvVar18;
  reference pvVar19;
  StreamReader<false,_false> *pSVar20;
  vector<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
  *pvVar21;
  size_type sVar22;
  int8_t *piVar23;
  Logger *pLVar24;
  basic_formatter *this_01;
  reference pvVar25;
  ulong uVar26;
  aiMaterial **ppaVar27;
  aiMaterial *paVar28;
  char *pcVar29;
  aiMesh **__s_00;
  aiMesh *this_02;
  ulong *puVar30;
  aiVector3t<float> *paVar31;
  const_reference pvVar32;
  void *pvVar33;
  mapped_type *pmVar34;
  undefined8 *puVar35;
  size_type sVar36;
  aiBone *this_03;
  reference ppVar37;
  aiVertexWeight *paVar38;
  aiNode *paVar39;
  uint *puVar40;
  aiNode **ppaVar41;
  aiAnimation **ppaVar42;
  aiAnimation *this_04;
  reference pTVar43;
  aiNodeAnim *this_05;
  aiQuatKey *paVar44;
  aiMatrix4x4t<float> *this_06;
  aiMatrix4x4t<float> *m_00;
  aiVectorKey *paVar45;
  reference pTVar46;
  aiFace *paVar47;
  aiVector3t<float> aVar48;
  aiVectorKey *local_1e30;
  aiQuatKey *local_1de8;
  aiVertexWeight *local_1d58;
  aiVector3t<float> *local_1ca0;
  aiVector3t<float> *local_1c78;
  aiVector3t<float> *local_1c50;
  aiFace *local_1c28;
  bool local_1b6d;
  aiVectorKey *v_4;
  __normal_iterator<const_Assimp::MS3DImporter::TempKeyFrame_*,_std::vector<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>_>
  local_19f0;
  const_iterator pos;
  aiQuatKey *qu;
  aiMatrix4x4t<float> local_199c;
  aiMatrix4x4t<float> local_195c;
  aiMatrix3x3t<float> local_191c;
  double local_18f8;
  double local_18f0;
  double *local_18e8;
  aiQuatKey *q;
  __normal_iterator<const_Assimp::MS3DImporter::TempKeyFrame_*,_std::vector<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>_>
  local_18d8;
  const_iterator rot;
  aiNodeAnim *nd;
  __normal_iterator<Assimp::MS3DImporter::TempJoint_*,_std::vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>_>
  local_18c0;
  __normal_iterator<const_Assimp::MS3DImporter::TempJoint_*,_std::vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>_>
  local_18b8;
  const_iterator it_1;
  aiAnimation *anim;
  aiNode *jt;
  uint i_18;
  aiNode *local_1878;
  aiNode *rt;
  aiVertexWeight *outwght;
  aiBone *outbone;
  uint bone;
  uint a_3;
  TempVertex *v_3;
  reference pvStack_1848;
  uint i_17;
  TempTriangle *t_4;
  uint n_2;
  uint i_16;
  TempJoint *jnt;
  aiBone *bn;
  _Rb_tree_const_iterator<std::pair<const_unsigned_int,_unsigned_int>_> local_1820;
  iterator local_1818;
  _Rb_tree_const_iterator<std::pair<const_unsigned_int,_unsigned_int>_> local_1810;
  const_iterator it;
  undefined1 local_1800 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> bmap;
  undefined4 local_17dc;
  _Self local_17d8;
  _Self local_17d0;
  undefined1 local_17c2;
  allocator<char> local_17c1;
  string local_17c0;
  uint local_179c;
  reference pvStack_1798;
  uint a_2;
  TempVertex *v_2;
  string local_1788;
  uint local_1764;
  reference pvStack_1760;
  uint i_15;
  TempTriangle *t_3;
  string local_1750;
  undefined4 *local_1730;
  aiFace *f;
  uint n_1;
  uint i_14;
  BoneSet mybones;
  string local_16e8;
  reference local_16c8;
  TempGroup *g_1;
  aiMesh *m_1;
  uint i_13;
  uint local_1690;
  allocator<char> local_1689;
  int sm;
  aiString local_1668;
  allocator<char> local_1261;
  string local_1260;
  aiString local_1240;
  allocator<char> local_e39;
  string local_e38;
  aiString local_e18;
  undefined1 local_a14 [8];
  aiString tmp;
  TempMaterial *mi;
  aiMaterial *mo;
  size_t i_12;
  TempGroup *g;
  float fStack_5e8;
  uint i_11;
  float local_5e0;
  float fStack_5dc;
  reference local_5d8;
  TempMaterial *m;
  uint local_43c;
  reference pvStack_438;
  uint n;
  TempVertex *v_1;
  uint local_428;
  uint i_10;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  string local_2a8;
  allocator local_281;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_260;
  string *s;
  string local_250;
  ulong local_230;
  size_t len;
  reference pvStack_220;
  uint32_t subversion;
  TempKeyFrame *kf_1;
  reference pvStack_210;
  uint a_1;
  TempKeyFrame *kf;
  reference pvStack_200;
  uint a;
  TempJoint *j;
  uint i_9;
  vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_> joints;
  uint16_t joint;
  uint32_t totalframes;
  float currenttime;
  float animfps;
  TempMaterial *t_2;
  uint i_8;
  vector<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
  materials;
  uint local_198;
  uint16_t mat;
  uint i_7;
  uint16_t num;
  TempGroup *t_1;
  uint i_6;
  vector<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_> groups;
  uint local_160;
  bool need_default;
  uint uStack_15c;
  uint16_t grp;
  uint i_5;
  uint i_4;
  uint i_3;
  uint i_2;
  TempTriangle *t;
  uint i_1;
  vector<Assimp::MS3DImporter::TempTriangle,_std::allocator<Assimp::MS3DImporter::TempTriangle>_>
  triangles;
  uint16_t tris;
  TempVertex *v;
  uint i;
  vector<Assimp::MS3DImporter::TempVertex,_std::allocator<Assimp::MS3DImporter::TempVertex>_>
  vertices;
  undefined1 local_f0 [4];
  uint16_t verts;
  undefined1 local_c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  int local_a4;
  char local_9e [2];
  int32_t version;
  char head [10];
  allocator<char> local_81;
  string local_80;
  undefined1 local_60 [8];
  StreamReaderLE stream;
  IOSystem *pIOHandler_local;
  aiScene *pScene_local;
  string *pFile_local;
  MS3DImporter *this_local;
  
  stream._48_8_ = pIOHandler;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"rb",&local_81);
  stream_00 = IOSystem::Open(pIOHandler,pFile,&local_80);
  StreamReader<false,_false>::StreamReader((StreamReader<false,_false> *)local_60,stream_00,false);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  this->mScene = pScene;
  StreamReader<false,_false>::CopyAndAdvance((StreamReader<false,_false> *)local_60,local_9e,10);
  StreamReader<false,false>::operator>>((StreamReader<false,false> *)local_60,&local_a4);
  iVar14 = strncmp(local_9e,"MS3D000000",10);
  if (iVar14 != 0) {
    local_c9 = 1;
    pDVar17 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::operator+(&local_c8,"Not a MS3D file, magic string MS3D000000 not found: ",pFile);
    DeadlyImportError::DeadlyImportError(pDVar17,&local_c8);
    local_c9 = 0;
    __cxa_throw(pDVar17,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  if (local_a4 != 4) {
    vertices.
    super__Vector_base<Assimp::MS3DImporter::TempVertex,_std::allocator<Assimp::MS3DImporter::TempVertex>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
    pDVar17 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_f0,"MS3D: Unsupported file format version, 4 was expected",
               (allocator<char> *)
               ((long)&vertices.
                       super__Vector_base<Assimp::MS3DImporter::TempVertex,_std::allocator<Assimp::MS3DImporter::TempVertex>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    DeadlyImportError::DeadlyImportError(pDVar17,(string *)local_f0);
    vertices.
    super__Vector_base<Assimp::MS3DImporter::TempVertex,_std::allocator<Assimp::MS3DImporter::TempVertex>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
    __cxa_throw(pDVar17,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  StreamReader<false,false>::operator>>
            ((StreamReader<false,false> *)local_60,
             (unsigned_short *)
             ((long)&vertices.
                     super__Vector_base<Assimp::MS3DImporter::TempVertex,_std::allocator<Assimp::MS3DImporter::TempVertex>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  uVar26 = (ulong)vertices.
                  super__Vector_base<Assimp::MS3DImporter::TempVertex,_std::allocator<Assimp::MS3DImporter::TempVertex>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_2_;
  std::allocator<Assimp::MS3DImporter::TempVertex>::allocator
            ((allocator<Assimp::MS3DImporter::TempVertex> *)((long)&v + 7));
  std::vector<Assimp::MS3DImporter::TempVertex,_std::allocator<Assimp::MS3DImporter::TempVertex>_>::
  vector((vector<Assimp::MS3DImporter::TempVertex,_std::allocator<Assimp::MS3DImporter::TempVertex>_>
          *)&i,uVar26,(allocator<Assimp::MS3DImporter::TempVertex> *)((long)&v + 7));
  std::allocator<Assimp::MS3DImporter::TempVertex>::~allocator
            ((allocator<Assimp::MS3DImporter::TempVertex> *)((long)&v + 7));
  for (v._0_4_ = 0;
      (uint)v < vertices.
                super__Vector_base<Assimp::MS3DImporter::TempVertex,_std::allocator<Assimp::MS3DImporter::TempVertex>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_2_; v._0_4_ = (uint)v + 1) {
    pos_00 = std::
             vector<Assimp::MS3DImporter::TempVertex,_std::allocator<Assimp::MS3DImporter::TempVertex>_>
             ::operator[]((vector<Assimp::MS3DImporter::TempVertex,_std::allocator<Assimp::MS3DImporter::TempVertex>_>
                           *)&i,(ulong)(uint)v);
    StreamReader<false,_false>::IncPtr((StreamReader<false,_false> *)local_60,1);
    ReadVector((StreamReaderLE *)local_60,&pos_00->pos);
    iVar11 = StreamReader<false,_false>::GetI1((StreamReader<false,_false> *)local_60);
    pos_00->bone_id[0] = (int)iVar11;
    iVar11 = StreamReader<false,_false>::GetI1((StreamReader<false,_false> *)local_60);
    pos_00->ref_cnt = (int)iVar11;
    pos_00->bone_id[3] = 0xffffffff;
    pos_00->bone_id[2] = 0xffffffff;
    pos_00->bone_id[1] = 0xffffffff;
    pos_00->weights[3] = 0.0;
    pos_00->weights[2] = 0.0;
    pos_00->weights[1] = 0.0;
    pos_00->weights[0] = 1.0;
  }
  StreamReader<false,false>::operator>>
            ((StreamReader<false,false> *)local_60,
             (unsigned_short *)
             ((long)&triangles.
                     super__Vector_base<Assimp::MS3DImporter::TempTriangle,_std::allocator<Assimp::MS3DImporter::TempTriangle>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  uVar26 = (ulong)triangles.
                  super__Vector_base<Assimp::MS3DImporter::TempTriangle,_std::allocator<Assimp::MS3DImporter::TempTriangle>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_2_;
  std::allocator<Assimp::MS3DImporter::TempTriangle>::allocator
            ((allocator<Assimp::MS3DImporter::TempTriangle> *)((long)&t + 7));
  std::
  vector<Assimp::MS3DImporter::TempTriangle,_std::allocator<Assimp::MS3DImporter::TempTriangle>_>::
  vector((vector<Assimp::MS3DImporter::TempTriangle,_std::allocator<Assimp::MS3DImporter::TempTriangle>_>
          *)&i_1,uVar26,(allocator<Assimp::MS3DImporter::TempTriangle> *)((long)&t + 7));
  std::allocator<Assimp::MS3DImporter::TempTriangle>::~allocator
            ((allocator<Assimp::MS3DImporter::TempTriangle> *)((long)&t + 7));
  for (t._0_4_ = 0;
      (uint)t < triangles.
                super__Vector_base<Assimp::MS3DImporter::TempTriangle,_std::allocator<Assimp::MS3DImporter::TempTriangle>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._6_2_; t._0_4_ = (uint)t + 1) {
    pvVar18 = std::
              vector<Assimp::MS3DImporter::TempTriangle,_std::allocator<Assimp::MS3DImporter::TempTriangle>_>
              ::operator[]((vector<Assimp::MS3DImporter::TempTriangle,_std::allocator<Assimp::MS3DImporter::TempTriangle>_>
                            *)&i_1,(ulong)(uint)t);
    StreamReader<false,_false>::IncPtr((StreamReader<false,_false> *)local_60,2);
    for (i_4 = 0; i_4 < 3; i_4 = i_4 + 1) {
      iVar13 = StreamReader<false,_false>::GetI2((StreamReader<false,_false> *)local_60);
      pvVar18->indices[i_4] = (int)iVar13;
    }
    for (i_5 = 0; i_5 < 3; i_5 = i_5 + 1) {
      ReadVector((StreamReaderLE *)local_60,pvVar18->normals + i_5);
    }
    for (uStack_15c = 0; uStack_15c < 3; uStack_15c = uStack_15c + 1) {
      StreamReader<false,false>::operator>>
                ((StreamReader<false,false> *)local_60,&pvVar18->uv[uStack_15c].x);
    }
    for (local_160 = 0; local_160 < 3; local_160 = local_160 + 1) {
      StreamReader<false,false>::operator>>
                ((StreamReader<false,false> *)local_60,&pvVar18->uv[local_160].y);
    }
    iVar11 = StreamReader<false,_false>::GetI1((StreamReader<false,_false> *)local_60);
    pvVar18->sg = (int)iVar11;
    iVar11 = StreamReader<false,_false>::GetI1((StreamReader<false,_false> *)local_60);
    pvVar18->group = (int)iVar11;
  }
  StreamReader<false,false>::operator>>
            ((StreamReader<false,false> *)local_60,
             (unsigned_short *)
             ((long)&groups.
                     super__Vector_base<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  groups.
  super__Vector_base<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ = 0;
  uVar26 = (ulong)groups.
                  super__Vector_base<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_2_;
  std::allocator<Assimp::MS3DImporter::TempGroup>::allocator
            ((allocator<Assimp::MS3DImporter::TempGroup> *)((long)&t_1 + 7));
  std::vector<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_>::
  vector((vector<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_>
          *)&i_6,uVar26,(allocator<Assimp::MS3DImporter::TempGroup> *)((long)&t_1 + 7));
  std::allocator<Assimp::MS3DImporter::TempGroup>::~allocator
            ((allocator<Assimp::MS3DImporter::TempGroup> *)((long)&t_1 + 7));
  for (t_1._0_4_ = 0;
      (uint)t_1 <
      groups.
      super__Vector_base<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._6_2_; t_1._0_4_ = (uint)t_1 + 1) {
    _i_7 = std::
           vector<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_>
           ::operator[]((vector<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_>
                         *)&i_6,(ulong)(uint)t_1);
    StreamReader<false,_false>::IncPtr((StreamReader<false,_false> *)local_60,1);
    StreamReader<false,_false>::CopyAndAdvance((StreamReader<false,_false> *)local_60,_i_7,0x20);
    _i_7->name[0x20] = '\0';
    StreamReader<false,false>::operator>>((StreamReader<false,false> *)local_60,&mat);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&_i_7->triangles,(ulong)mat);
    for (local_198 = 0; local_198 < mat; local_198 = local_198 + 1) {
      iVar13 = StreamReader<false,_false>::GetI2((StreamReader<false,_false> *)local_60);
      pvVar19 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          (&_i_7->triangles,(ulong)local_198);
      *pvVar19 = (int)iVar13;
    }
    iVar11 = StreamReader<false,_false>::GetI1((StreamReader<false,_false> *)local_60);
    _i_7->mat = (int)iVar11;
    if (_i_7->mat == 0xffffffff) {
      groups.
      super__Vector_base<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ = 1;
    }
  }
  StreamReader<false,false>::operator>>
            ((StreamReader<false,false> *)local_60,
             (unsigned_short *)
             ((long)&materials.
                     super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  uVar26 = (ulong)materials.
                  super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_2_;
  std::allocator<Assimp::MS3DImporter::TempMaterial>::allocator
            ((allocator<Assimp::MS3DImporter::TempMaterial> *)((long)&t_2 + 7));
  std::
  vector<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>::
  vector((vector<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
          *)&i_8,uVar26,(allocator<Assimp::MS3DImporter::TempMaterial> *)((long)&t_2 + 7));
  std::allocator<Assimp::MS3DImporter::TempMaterial>::~allocator
            ((allocator<Assimp::MS3DImporter::TempMaterial> *)((long)&t_2 + 7));
  for (t_2._0_4_ = 0;
      (uint)t_2 <
      materials.
      super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._6_2_; t_2._0_4_ = (uint)t_2 + 1) {
    _currenttime = std::
                   vector<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
                   ::operator[]((vector<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
                                 *)&i_8,(ulong)(uint)t_2);
    StreamReader<false,_false>::CopyAndAdvance
              ((StreamReader<false,_false> *)local_60,_currenttime,0x20);
    _currenttime->name[0x20] = '\0';
    ReadColor((StreamReaderLE *)local_60,&_currenttime->ambient);
    ReadColor((StreamReaderLE *)local_60,&_currenttime->diffuse);
    ReadColor((StreamReaderLE *)local_60,&_currenttime->specular);
    ReadColor((StreamReaderLE *)local_60,&_currenttime->emissive);
    pSVar20 = StreamReader<false,false>::operator>>
                        ((StreamReader<false,false> *)local_60,&_currenttime->shininess);
    StreamReader<false,false>::operator>>
              ((StreamReader<false,false> *)pSVar20,&_currenttime->transparency);
    StreamReader<false,_false>::IncPtr((StreamReader<false,_false> *)local_60,1);
    StreamReader<false,_false>::CopyAndAdvance
              ((StreamReader<false,_false> *)local_60,_currenttime->texture,0x80);
    _currenttime->texture[0x80] = '\0';
    StreamReader<false,_false>::CopyAndAdvance
              ((StreamReader<false,_false> *)local_60,_currenttime->alphamap,0x80);
    _currenttime->alphamap[0x80] = '\0';
  }
  pSVar20 = StreamReader<false,false>::operator>>
                      ((StreamReader<false,false> *)local_60,(float *)&totalframes);
  pSVar20 = StreamReader<false,false>::operator>>
                      ((StreamReader<false,false> *)pSVar20,(float *)&stack0xfffffffffffffe30);
  StreamReader<false,false>::operator>>
            ((StreamReader<false,false> *)pSVar20,
             (uint *)((long)&joints.
                             super__Vector_base<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  StreamReader<false,false>::operator>>
            ((StreamReader<false,false> *)local_60,
             (unsigned_short *)
             ((long)&joints.
                     super__Vector_base<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 2));
  uVar26 = (ulong)joints.
                  super__Vector_base<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._2_2_;
  std::allocator<Assimp::MS3DImporter::TempJoint>::allocator
            ((allocator<Assimp::MS3DImporter::TempJoint> *)((long)&j + 7));
  std::vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>::
  vector((vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
          *)&i_9,uVar26,(allocator<Assimp::MS3DImporter::TempJoint> *)((long)&j + 7));
  std::allocator<Assimp::MS3DImporter::TempJoint>::~allocator
            ((allocator<Assimp::MS3DImporter::TempJoint> *)((long)&j + 7));
  for (j._0_4_ = 0;
      (uint)j < joints.
                super__Vector_base<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._2_2_; j._0_4_ = (uint)j + 1) {
    pvStack_200 = std::
                  vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
                  ::operator[]((vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
                                *)&i_9,(ulong)(uint)j);
    StreamReader<false,_false>::IncPtr((StreamReader<false,_false> *)local_60,1);
    StreamReader<false,_false>::CopyAndAdvance
              ((StreamReader<false,_false> *)local_60,pvStack_200,0x20);
    pvStack_200->name[0x20] = '\0';
    StreamReader<false,_false>::CopyAndAdvance
              ((StreamReader<false,_false> *)local_60,pvStack_200->parentName,0x20);
    pvStack_200->parentName[0x20] = '\0';
    ReadVector((StreamReaderLE *)local_60,&pvStack_200->rotation);
    ReadVector((StreamReaderLE *)local_60,&pvStack_200->position);
    pvVar21 = &pvStack_200->rotFrames;
    iVar13 = StreamReader<false,_false>::GetI2((StreamReader<false,_false> *)local_60);
    std::
    vector<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
    ::resize(pvVar21,(long)iVar13);
    pvVar21 = &pvStack_200->posFrames;
    iVar13 = StreamReader<false,_false>::GetI2((StreamReader<false,_false> *)local_60);
    std::
    vector<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
    ::resize(pvVar21,(long)iVar13);
    for (kf._4_4_ = 0; uVar26 = (ulong)kf._4_4_,
        sVar22 = std::
                 vector<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
                 ::size(&pvStack_200->rotFrames), uVar26 < sVar22; kf._4_4_ = kf._4_4_ + 1) {
      pvStack_210 = std::
                    vector<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
                    ::operator[](&pvStack_200->rotFrames,(ulong)kf._4_4_);
      StreamReader<false,false>::operator>>
                ((StreamReader<false,false> *)local_60,&pvStack_210->time);
      ReadVector((StreamReaderLE *)local_60,&pvStack_210->value);
    }
    for (kf_1._4_4_ = 0; uVar26 = (ulong)kf_1._4_4_,
        sVar22 = std::
                 vector<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
                 ::size(&pvStack_200->posFrames), uVar26 < sVar22; kf_1._4_4_ = kf_1._4_4_ + 1) {
      pvStack_220 = std::
                    vector<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
                    ::operator[](&pvStack_200->posFrames,(ulong)kf_1._4_4_);
      StreamReader<false,false>::operator>>
                ((StreamReader<false,false> *)local_60,&pvStack_220->time);
      ReadVector((StreamReaderLE *)local_60,&pvStack_220->value);
    }
  }
  uVar15 = StreamReader<false,_false>::GetRemainingSize((StreamReader<false,_false> *)local_60);
  if ((4 < uVar15) &&
     (StreamReader<false,false>::operator>>
                ((StreamReader<false,false> *)local_60,(uint *)((long)&len + 4)), len._4_4_ == 1)) {
    ReadComments<Assimp::MS3DImporter::TempGroup>
              (this,(StreamReaderLE *)local_60,
               (vector<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_>
                *)&i_6);
    ReadComments<Assimp::MS3DImporter::TempMaterial>
              (this,(StreamReaderLE *)local_60,
               (vector<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
                *)&i_8);
    ReadComments<Assimp::MS3DImporter::TempJoint>
              (this,(StreamReaderLE *)local_60,
               (vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
                *)&i_9);
    iVar16 = StreamReader<false,_false>::GetI4((StreamReader<false,_false> *)local_60);
    if (iVar16 != 0) {
      iVar16 = StreamReader<false,_false>::GetI4((StreamReader<false,_false> *)local_60);
      local_230 = (long)iVar16;
      uVar15 = StreamReader<false,_false>::GetRemainingSize((StreamReader<false,_false> *)local_60);
      if ((ulong)uVar15 < (ulong)(long)iVar16) {
        s._6_1_ = 1;
        pDVar17 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_250,"MS3D: Model comment is too long",
                   (allocator<char> *)((long)&s + 7));
        DeadlyImportError::DeadlyImportError(pDVar17,&local_250);
        s._6_1_ = 0;
        __cxa_throw(pDVar17,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      piVar23 = StreamReader<false,_false>::GetPtr((StreamReader<false,_false> *)local_60);
      uVar26 = local_230;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_280,piVar23,uVar26,&local_281);
      std::allocator<char>::~allocator((allocator<char> *)&local_281);
      local_260 = &local_280;
      pLVar24 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[22]>(&local_420,(char (*) [22])"MS3D: Model comment: ");
      this_01 = (basic_formatter *)
                Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                          &local_420,local_260);
      Formatter::basic_formatter::operator_cast_to_string(&local_2a8,this_01);
      Logger::debug(pLVar24,&local_2a8);
      std::__cxx11::string::~string((string *)&local_2a8);
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      ~basic_formatter(&local_420);
      std::__cxx11::string::~string((string *)&local_280);
    }
    uVar15 = StreamReader<false,_false>::GetRemainingSize((StreamReader<false,_false> *)local_60);
    local_1b6d = false;
    if (4 < uVar15) {
      StreamReader<false,false>::operator>>
                ((StreamReader<false,false> *)local_60,(uint *)((long)&len + 4));
      i_10 = 1;
      local_428 = 3;
      local_1b6d = inrange<unsigned_int,unsigned_int,unsigned_int>
                             ((uint *)((long)&len + 4),&i_10,&local_428);
    }
    if (local_1b6d != false) {
      for (v_1._4_4_ = 0;
          v_1._4_4_ <
          vertices.
          super__Vector_base<Assimp::MS3DImporter::TempVertex,_std::allocator<Assimp::MS3DImporter::TempVertex>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_2_; v_1._4_4_ = v_1._4_4_ + 1) {
        pvStack_438 = std::
                      vector<Assimp::MS3DImporter::TempVertex,_std::allocator<Assimp::MS3DImporter::TempVertex>_>
                      ::operator[]((vector<Assimp::MS3DImporter::TempVertex,_std::allocator<Assimp::MS3DImporter::TempVertex>_>
                                    *)&i,(ulong)v_1._4_4_);
        pvStack_438->weights[3] = 1.0;
        local_43c = 0;
        while (local_43c < 3) {
          iVar11 = StreamReader<false,_false>::GetI1((StreamReader<false,_false> *)local_60);
          pvStack_438->bone_id[local_43c + 1] = (int)iVar11;
          iVar11 = StreamReader<false,_false>::GetI1((StreamReader<false,_false> *)local_60);
          pvStack_438->weights[local_43c] = (float)(uint)(int)iVar11 / 255.0;
          pvStack_438->weights[3] = pvStack_438->weights[3] - pvStack_438->weights[local_43c];
          local_43c = local_43c + 1;
        }
        StreamReader<false,_false>::IncPtr
                  ((StreamReader<false,_false> *)local_60,(ulong)(len._4_4_ * 4 - 4));
      }
    }
  }
  if (((groups.
        super__Vector_base<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ & 1) != 0) &&
     (sVar22 = std::
               vector<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
               ::size((vector<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
                       *)&i_8), sVar22 != 0)) {
    pLVar24 = DefaultLogger::get();
    Logger::warn(pLVar24,"MS3D: Found group with no material assigned, spawning default material");
    memset((TempMaterial *)&m,0,400);
    TempMaterial::TempMaterial((TempMaterial *)&m);
    std::
    vector<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ::push_back((vector<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
                 *)&i_8,(TempMaterial *)&m);
    TempMaterial::~TempMaterial((TempMaterial *)&m);
    local_5d8 = std::
                vector<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
                ::back((vector<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
                        *)&i_8);
    strcpy(local_5d8->name,"<MS3D_DefaultMat>");
    aiColor4t<float>::aiColor4t((aiColor4t<float> *)&stack0xfffffffffffffa18,0.6,0.6,0.6,1.0);
    (local_5d8->diffuse).r = fStack_5e8;
    (local_5d8->diffuse).g = (float)i_11;
    (local_5d8->diffuse).b = local_5e0;
    (local_5d8->diffuse).a = fStack_5dc;
    local_5d8->transparency = 1.0;
    local_5d8->shininess = 0.0;
    local_5d8->alphamap[0] = '\0';
    local_5d8->texture[0] = '\0';
    for (g._4_4_ = 0;
        sVar22 = std::
                 vector<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_>
                 ::size((vector<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_>
                         *)&i_6), g._4_4_ < sVar22; g._4_4_ = g._4_4_ + 1) {
      pvVar25 = std::
                vector<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_>
                ::operator[]((vector<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_>
                              *)&i_6,(ulong)g._4_4_);
      if (pvVar25->mat == 0xffffffff) {
        sVar22 = std::
                 vector<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
                 ::size((vector<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
                         *)&i_8);
        pvVar25->mat = (int)sVar22 - 1;
      }
    }
  }
  sVar22 = std::
           vector<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
           ::size((vector<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
                   *)&i_8);
  if (sVar22 != 0) {
    sVar22 = std::
             vector<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
             ::size((vector<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
                     *)&i_8);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = sVar22;
    uVar26 = SUB168(auVar6 * ZEXT816(8),0);
    if (SUB168(auVar6 * ZEXT816(8),8) != 0) {
      uVar26 = 0xffffffffffffffff;
    }
    ppaVar27 = (aiMaterial **)operator_new__(uVar26);
    pScene->mMaterials = ppaVar27;
    for (mo = (aiMaterial *)0x0;
        paVar28 = (aiMaterial *)
                  std::
                  vector<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
                  ::size((vector<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
                          *)&i_8), mo < paVar28; mo = (aiMaterial *)((long)&mo->mProperties + 1)) {
      paVar28 = (aiMaterial *)operator_new(0x10);
      aiMaterial::aiMaterial(paVar28);
      uVar15 = pScene->mNumMaterials;
      pScene->mNumMaterials = uVar15 + 1;
      pScene->mMaterials[uVar15] = paVar28;
      tmp.data._1016_8_ =
           std::
           vector<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
           ::operator[]((vector<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
                         *)&i_8,(size_type)mo);
      aiString::aiString((aiString *)local_a14);
      if (*(char *)(tmp.data._1016_8_ + 0xa2) != '\0') {
        pcVar29 = (char *)(tmp.data._1016_8_ + 0xa2);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_e38,pcVar29,&local_e39);
        aiString::aiString(&local_e18,&local_e38);
        aiString::operator=((aiString *)local_a14,&local_e18);
        std::__cxx11::string::~string((string *)&local_e38);
        std::allocator<char>::~allocator(&local_e39);
        aiMaterial::AddProperty(paVar28,(aiString *)local_a14,"$tex.file",8,0);
      }
      if (*(char *)(tmp.data._1016_8_ + 0x21) != '\0') {
        pcVar29 = (char *)(tmp.data._1016_8_ + 0x21);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1260,pcVar29,&local_1261);
        aiString::aiString(&local_1240,&local_1260);
        aiString::operator=((aiString *)local_a14,&local_1240);
        std::__cxx11::string::~string((string *)&local_1260);
        std::allocator<char>::~allocator(&local_1261);
        aiMaterial::AddProperty(paVar28,(aiString *)local_a14,"$tex.file",1,0);
      }
      __s = tmp.data._1016_8_;
      if (*(char *)tmp.data._1016_8_ != '\0') {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&sm,(char *)__s,&local_1689);
        aiString::aiString(&local_1668,(string *)&sm);
        aiString::operator=((aiString *)local_a14,&local_1668);
        std::__cxx11::string::~string((string *)&sm);
        std::allocator<char>::~allocator(&local_1689);
        aiMaterial::AddProperty(paVar28,(aiString *)local_a14,"?mat.name",0,0);
      }
      aiMaterial::AddProperty(paVar28,(aiColor4D *)(tmp.data._1016_8_ + 0x144),1,"$clr.ambient",0,0)
      ;
      aiMaterial::AddProperty(paVar28,(aiColor4D *)(tmp.data._1016_8_ + 0x124),1,"$clr.diffuse",0,0)
      ;
      aiMaterial::AddProperty
                (paVar28,(aiColor4D *)(tmp.data._1016_8_ + 0x134),1,"$clr.specular",0,0);
      aiMaterial::AddProperty
                (paVar28,(aiColor4D *)(tmp.data._1016_8_ + 0x154),1,"$clr.emissive",0,0);
      aiMaterial::AddProperty(paVar28,(float *)(tmp.data._1016_8_ + 0x164),1,"$mat.shininess",0,0);
      aiMaterial::AddProperty(paVar28,(float *)(tmp.data._1016_8_ + 0x168),1,"$mat.opacity",0,0);
      local_1690 = 0.0 < *(float *)(tmp.data._1016_8_ + 0x164) | 2;
      aiMaterial::AddProperty(paVar28,(int *)&local_1690,1,"$mat.shadingm",0,0);
    }
  }
  bVar12 = std::
           vector<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_>
           ::empty((vector<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_>
                    *)&i_6);
  if (bVar12) {
    m_1._6_1_ = 1;
    pDVar17 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&i_13,"MS3D: Didn\'t get any group records, file is malformed",
               (allocator<char> *)((long)&m_1 + 7));
    DeadlyImportError::DeadlyImportError(pDVar17,(string *)&i_13);
    m_1._6_1_ = 0;
    __cxa_throw(pDVar17,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  sVar22 = std::
           vector<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_>
           ::size((vector<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_>
                   *)&i_6);
  pScene->mNumMeshes = (uint)sVar22;
  uVar26 = (sVar22 & 0xffffffff) << 3;
  __s_00 = (aiMesh **)operator_new__(uVar26);
  memset(__s_00,0,uVar26);
  pScene->mMeshes = __s_00;
  for (m_1._0_4_ = 0; (uint)m_1 < pScene->mNumMeshes; m_1._0_4_ = (uint)m_1 + 1) {
    this_02 = (aiMesh *)operator_new(0x520);
    aiMesh::aiMesh(this_02);
    pScene->mMeshes[(uint)m_1] = this_02;
    g_1 = (TempGroup *)this_02;
    local_16c8 = std::
                 vector<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_>
                 ::operator[]((vector<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_>
                               *)&i_6,(ulong)(uint)m_1);
    if ((pScene->mNumMaterials != 0) && (pScene->mNumMaterials < local_16c8->mat)) {
      mybones._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = 1;
      pDVar17 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_16e8,"MS3D: Encountered invalid material index, file is malformed"
                 ,(allocator<char> *)
                  ((long)&mybones._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
      DeadlyImportError::DeadlyImportError(pDVar17,&local_16e8);
      mybones._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = 0;
      __cxa_throw(pDVar17,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    *(uint *)(g_1[2].name + 0x18) = local_16c8->mat;
    g_1->name[0] = '\x04';
    g_1->name[1] = '\0';
    g_1->name[2] = '\0';
    g_1->name[3] = '\0';
    sVar22 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_16c8->triangles);
    *(int *)(g_1->name + 8) = (int)sVar22;
    uVar26 = sVar22 & 0xffffffff;
    puVar30 = (ulong *)operator_new__(uVar26 << 4 | 8);
    *puVar30 = uVar26;
    paVar47 = (aiFace *)(puVar30 + 1);
    if (uVar26 != 0) {
      local_1c28 = paVar47;
      do {
        aiFace::aiFace(local_1c28);
        local_1c28 = local_1c28 + 1;
      } while (local_1c28 != paVar47 + uVar26);
    }
    *(aiFace **)g_1[2].name = paVar47;
    *(int *)(g_1->name + 4) = *(int *)(g_1->name + 8) * 3;
    uVar26 = (ulong)*(uint *)(g_1->name + 4);
    paVar31 = (aiVector3t<float> *)operator_new__(uVar26 * 0xc);
    if (uVar26 != 0) {
      local_1c50 = paVar31;
      do {
        aiVector3t<float>::aiVector3t(local_1c50);
        local_1c50 = local_1c50 + 1;
      } while (local_1c50 != paVar31 + uVar26);
    }
    *(aiVector3t<float> **)(g_1->name + 0x10) = paVar31;
    uVar26 = (ulong)*(uint *)(g_1->name + 4);
    paVar31 = (aiVector3t<float> *)operator_new__(uVar26 * 0xc);
    if (uVar26 != 0) {
      local_1c78 = paVar31;
      do {
        aiVector3t<float>::aiVector3t(local_1c78);
        local_1c78 = local_1c78 + 1;
      } while (local_1c78 != paVar31 + uVar26);
    }
    *(aiVector3t<float> **)(g_1->name + 0x18) = paVar31;
    uVar26 = (ulong)*(uint *)(g_1->name + 4);
    paVar31 = (aiVector3t<float> *)operator_new__(uVar26 * 0xc);
    if (uVar26 != 0) {
      local_1ca0 = paVar31;
      do {
        aiVector3t<float>::aiVector3t(local_1ca0);
        local_1ca0 = local_1ca0 + 1;
      } while (local_1ca0 != paVar31 + uVar26);
    }
    *(aiVector3t<float> **)(g_1[1].name + 8) = paVar31;
    *(undefined4 *)&g_1[1].comment = 2;
    std::
    map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
    ::map((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
           *)&n_1);
    f._0_4_ = 0;
    for (f._4_4_ = 0; f._4_4_ < *(uint *)(g_1->name + 8); f._4_4_ = f._4_4_ + 1) {
      local_1730 = (undefined4 *)(*(long *)g_1[2].name + (ulong)f._4_4_ * 0x10);
      pvVar32 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          (&local_16c8->triangles,(ulong)f._4_4_);
      uVar15 = *pvVar32;
      sVar22 = std::
               vector<Assimp::MS3DImporter::TempTriangle,_std::allocator<Assimp::MS3DImporter::TempTriangle>_>
               ::size((vector<Assimp::MS3DImporter::TempTriangle,_std::allocator<Assimp::MS3DImporter::TempTriangle>_>
                       *)&i_1);
      if (sVar22 < uVar15) {
        t_3._6_1_ = 1;
        pDVar17 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1750,
                   "MS3D: Encountered invalid triangle index, file is malformed",
                   (allocator<char> *)((long)&t_3 + 7));
        DeadlyImportError::DeadlyImportError(pDVar17,&local_1750);
        t_3._6_1_ = 0;
        __cxa_throw(pDVar17,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      pvVar32 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          (&local_16c8->triangles,(ulong)f._4_4_);
      pvStack_1760 = std::
                     vector<Assimp::MS3DImporter::TempTriangle,_std::allocator<Assimp::MS3DImporter::TempTriangle>_>
                     ::operator[]((vector<Assimp::MS3DImporter::TempTriangle,_std::allocator<Assimp::MS3DImporter::TempTriangle>_>
                                   *)&i_1,(ulong)*pvVar32);
      *local_1730 = 3;
      pvVar33 = operator_new__(0xc);
      *(void **)(local_1730 + 2) = pvVar33;
      for (local_1764 = 0; local_1764 < 3; local_1764 = local_1764 + 1) {
        uVar15 = pvStack_1760->indices[local_1764];
        sVar22 = std::
                 vector<Assimp::MS3DImporter::TempVertex,_std::allocator<Assimp::MS3DImporter::TempVertex>_>
                 ::size((vector<Assimp::MS3DImporter::TempVertex,_std::allocator<Assimp::MS3DImporter::TempVertex>_>
                         *)&i);
        if (sVar22 < uVar15) {
          v_2._6_1_ = 1;
          pDVar17 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1788,
                     "MS3D: Encountered invalid vertex index, file is malformed",
                     (allocator<char> *)((long)&v_2 + 7));
          DeadlyImportError::DeadlyImportError(pDVar17,&local_1788);
          v_2._6_1_ = 0;
          __cxa_throw(pDVar17,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
        }
        pvStack_1798 = std::
                       vector<Assimp::MS3DImporter::TempVertex,_std::allocator<Assimp::MS3DImporter::TempVertex>_>
                       ::operator[]((vector<Assimp::MS3DImporter::TempVertex,_std::allocator<Assimp::MS3DImporter::TempVertex>_>
                                     *)&i,(ulong)pvStack_1760->indices[local_1764]);
        for (local_179c = 0; local_179c < 4; local_179c = local_179c + 1) {
          if (pvStack_1798->bone_id[local_179c] != 0xffffffff) {
            uVar15 = pvStack_1798->bone_id[local_179c];
            sVar22 = std::
                     vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
                     ::size((vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
                             *)&i_9);
            if (sVar22 <= uVar15) {
              local_17c2 = 1;
              pDVar17 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_17c0,
                         "MS3D: Encountered invalid bone index, file is malformed",&local_17c1);
              DeadlyImportError::DeadlyImportError(pDVar17,&local_17c0);
              local_17c2 = 0;
              __cxa_throw(pDVar17,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError
                         );
            }
            local_17d0._M_node =
                 (_Base_ptr)
                 std::
                 map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                 ::find((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                         *)&n_1,pvStack_1798->bone_id + local_179c);
            local_17d8._M_node =
                 (_Base_ptr)
                 std::
                 map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                 ::end((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                        *)&n_1);
            bVar12 = std::operator==(&local_17d0,&local_17d8);
            if (bVar12) {
              pmVar34 = std::
                        map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                        ::operator[]((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                      *)&n_1,pvStack_1798->bone_id + local_179c);
              *pmVar34 = 1;
            }
            else {
              pmVar34 = std::
                        map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                        ::operator[]((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                      *)&n_1,pvStack_1798->bone_id + local_179c);
              *pmVar34 = *pmVar34 + 1;
            }
          }
        }
        lVar4 = *(long *)(g_1->name + 0x10);
        *(float *)(lVar4 + 8 + (ulong)(uint)f * 0xc) = (pvStack_1798->pos).z;
        *(undefined8 *)(lVar4 + (ulong)(uint)f * 0xc) = *(undefined8 *)&pvStack_1798->pos;
        lVar4 = *(long *)(g_1->name + 0x18);
        *(float *)(lVar4 + 8 + (ulong)(uint)f * 0xc) = pvStack_1760->normals[local_1764].z;
        *(undefined8 *)(lVar4 + (ulong)(uint)f * 0xc) =
             *(undefined8 *)(pvStack_1760->normals + local_1764);
        aiVector3t<float>::aiVector3t
                  ((aiVector3t<float> *)
                   ((long)&bmap.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                   pvStack_1760->uv[local_1764].x,1.0 - pvStack_1760->uv[local_1764].y,0.0);
        puVar35 = (undefined8 *)(*(long *)(g_1[1].name + 8) + (ulong)(uint)f * 0xc);
        *puVar35 = stack0xffffffffffffe81c;
        *(undefined4 *)(puVar35 + 1) = local_17dc;
        *(uint *)(*(long *)(local_1730 + 2) + (ulong)local_1764 * 4) = (uint)f;
        f._0_4_ = (uint)f + 1;
      }
    }
    bVar12 = std::
             map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::empty((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                      *)&n_1);
    if (!bVar12) {
      sVar22 = std::
               vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
               ::size((vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
                       *)&i_9);
      this_00 = (allocator<unsigned_int> *)((long)&it._M_node + 7);
      std::allocator<unsigned_int>::allocator(this_00);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1800,sVar22,this_00);
      std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&it._M_node + 7));
      sVar36 = std::
               map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               ::size((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                       *)&n_1);
      auVar7._8_8_ = 0;
      auVar7._0_8_ = sVar36;
      uVar26 = SUB168(auVar7 * ZEXT816(8),0);
      if (SUB168(auVar7 * ZEXT816(8),8) != 0) {
        uVar26 = 0xffffffffffffffff;
      }
      pvVar33 = operator_new__(uVar26);
      memset(pvVar33,0,uVar26);
      *(void **)(g_1[2].name + 0x10) = pvVar33;
      local_1818._M_node =
           (_Base_ptr)
           std::
           map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
           ::begin((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                    *)&n_1);
      std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_unsigned_int>_>::
      _Rb_tree_const_iterator(&local_1810,&local_1818);
      while( true ) {
        bn = (aiBone *)
             std::
             map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::end((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                    *)&n_1);
        std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_unsigned_int>_>::
        _Rb_tree_const_iterator(&local_1820,(iterator *)&bn);
        bVar12 = std::operator!=(&local_1810,&local_1820);
        if (!bVar12) break;
        this_03 = (aiBone *)operator_new(0x460);
        aiBone::aiBone(this_03);
        *(aiBone **)(*(long *)(g_1[2].name + 0x10) + (ulong)*(uint *)(g_1[2].name + 8) * 8) =
             this_03;
        jnt = (TempJoint *)this_03;
        ppVar37 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_unsigned_int>_>::
                  operator*(&local_1810);
        _n_2 = std::
               vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
               ::operator[]((vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
                             *)&i_9,(ulong)ppVar37->first);
        aiString::Set((aiString *)jnt,_n_2->name);
        ppVar37 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_unsigned_int>_>::
                  operator*(&local_1810);
        uVar26 = (ulong)ppVar37->second;
        paVar38 = (aiVertexWeight *)operator_new__(uVar26 << 3);
        if (uVar26 != 0) {
          local_1d58 = paVar38;
          do {
            aiVertexWeight::aiVertexWeight(local_1d58);
            local_1d58 = local_1d58 + 1;
          } while (local_1d58 != paVar38 + uVar26);
        }
        *(aiVertexWeight **)((long)&jnt[5].comment.field_2 + 8) = paVar38;
        vVar2 = *(value_type *)(g_1[2].name + 8);
        *(value_type *)(g_1[2].name + 8) = vVar2 + 1;
        ppVar37 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_unsigned_int>_>::
                  operator*(&local_1810);
        pvVar19 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1800,
                             (ulong)ppVar37->first);
        *pvVar19 = vVar2;
        std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_unsigned_int>_>::operator++
                  (&local_1810);
      }
      t_4._0_4_ = 0;
      for (t_4._4_4_ = 0; t_4._4_4_ < *(uint *)(g_1->name + 8); t_4._4_4_ = t_4._4_4_ + 1) {
        pvVar32 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            (&local_16c8->triangles,(ulong)t_4._4_4_);
        pvStack_1848 = std::
                       vector<Assimp::MS3DImporter::TempTriangle,_std::allocator<Assimp::MS3DImporter::TempTriangle>_>
                       ::operator[]((vector<Assimp::MS3DImporter::TempTriangle,_std::allocator<Assimp::MS3DImporter::TempTriangle>_>
                                     *)&i_1,(ulong)*pvVar32);
        for (v_3._4_4_ = 0; v_3._4_4_ < 3; v_3._4_4_ = v_3._4_4_ + 1) {
          _bone = std::
                  vector<Assimp::MS3DImporter::TempVertex,_std::allocator<Assimp::MS3DImporter::TempVertex>_>
                  ::operator[]((vector<Assimp::MS3DImporter::TempVertex,_std::allocator<Assimp::MS3DImporter::TempVertex>_>
                                *)&i,(ulong)pvStack_1848->indices[v_3._4_4_]);
          for (outbone._4_4_ = 0; outbone._4_4_ < 4; outbone._4_4_ = outbone._4_4_ + 1) {
            outbone._0_4_ = _bone->bone_id[outbone._4_4_];
            if ((uint)outbone != 0xffffffff) {
              lVar4 = *(long *)(g_1[2].name + 0x10);
              pvVar19 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1800
                                   ,(ulong)(uint)outbone);
              outwght = *(aiVertexWeight **)(lVar4 + (ulong)*pvVar19 * 8);
              aVar5 = outwght[0x83];
              fVar3 = outwght[0x80].mWeight;
              outwght[0x80].mWeight = (float)((int)fVar3 + 1);
              rt = (aiNode *)((long)aVar5 + (ulong)(uint)fVar3 * 8);
              (rt->mName).length = (ai_uint32)t_4;
              *(float *)(rt->mName).data = _bone->weights[outbone._4_4_];
            }
          }
          t_4._0_4_ = (ai_uint32)t_4 + 1;
        }
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1800);
    }
    std::
    map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
    ::~map((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
            *)&n_1);
  }
  paVar39 = (aiNode *)operator_new(0x478);
  jt._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&i_18,"<MS3DRoot>",(allocator<char> *)((long)&jt + 7));
  aiNode::aiNode(paVar39,(string *)&i_18);
  jt._6_1_ = 0;
  pScene->mRootNode = paVar39;
  std::__cxx11::string::~string((string *)&i_18);
  std::allocator<char>::~allocator((allocator<char> *)((long)&jt + 7));
  local_1878 = paVar39;
  puVar40 = (uint *)operator_new__((ulong)pScene->mNumMeshes << 2);
  local_1878->mMeshes = puVar40;
  for (jt._0_4_ = 0; (uint)jt < pScene->mNumMeshes; jt._0_4_ = (uint)jt + 1) {
    uVar15 = local_1878->mNumMeshes;
    local_1878->mNumMeshes = uVar15 + 1;
    local_1878->mMeshes[uVar15] = (uint)jt;
  }
  sVar22 = std::
           vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
           ::size((vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
                   *)&i_9);
  if (sVar22 != 0) {
    ppaVar41 = (aiNode **)operator_new__(8);
    *ppaVar41 = (aiNode *)0x0;
    local_1878->mChildren = ppaVar41;
    local_1878->mNumChildren = 1;
    paVar39 = (aiNode *)operator_new(0x478);
    aiNode::aiNode(paVar39);
    *local_1878->mChildren = paVar39;
    paVar39->mParent = local_1878;
    CollectChildJoints(this,(vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
                             *)&i_9,paVar39);
    aiString::Set((aiString *)paVar39,"<MS3DJointRoot>");
    pScene->mNumAnimations = 1;
    ppaVar42 = (aiAnimation **)operator_new__(8);
    pScene->mAnimations = ppaVar42;
    this_04 = (aiAnimation *)operator_new(0x448);
    aiAnimation::aiAnimation(this_04);
    *pScene->mAnimations = this_04;
    it_1._M_current = (TempJoint *)this_04;
    aiString::Set((aiString *)this_04,"<MS3DMasterAnim>");
    *(double *)&it_1._M_current[5].comment.field_2 = (double)(float)totalframes;
    sVar22 = std::
             vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
             ::size((vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
                     *)&i_9);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = sVar22;
    uVar26 = SUB168(auVar8 * ZEXT816(8),0);
    if (SUB168(auVar8 * ZEXT816(8),8) != 0) {
      uVar26 = 0xffffffffffffffff;
    }
    pvVar33 = operator_new__(uVar26);
    memset(pvVar33,0,uVar26);
    *(void **)it_1._M_current[6].name = pvVar33;
    local_18c0._M_current =
         (TempJoint *)
         std::
         vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>::
         begin((vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
                *)&i_9);
    __gnu_cxx::
    __normal_iterator<Assimp::MS3DImporter::TempJoint_const*,std::vector<Assimp::MS3DImporter::TempJoint,std::allocator<Assimp::MS3DImporter::TempJoint>>>
    ::__normal_iterator<Assimp::MS3DImporter::TempJoint*>
              ((__normal_iterator<Assimp::MS3DImporter::TempJoint_const*,std::vector<Assimp::MS3DImporter::TempJoint,std::allocator<Assimp::MS3DImporter::TempJoint>>>
                *)&local_18b8,&local_18c0);
    while( true ) {
      nd = (aiNodeAnim *)
           std::
           vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
           ::end((vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
                  *)&i_9);
      bVar12 = __gnu_cxx::operator!=
                         (&local_18b8,
                          (__normal_iterator<Assimp::MS3DImporter::TempJoint_*,_std::vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>_>
                           *)&nd);
      if (!bVar12) break;
      pTVar43 = __gnu_cxx::
                __normal_iterator<const_Assimp::MS3DImporter::TempJoint_*,_std::vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>_>
                ::operator*(&local_18b8);
      bVar12 = std::
               vector<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
               ::empty(&pTVar43->rotFrames);
      if (bVar12) {
        pTVar43 = __gnu_cxx::
                  __normal_iterator<const_Assimp::MS3DImporter::TempJoint_*,_std::vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>_>
                  ::operator*(&local_18b8);
        bVar12 = std::
                 vector<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
                 ::empty(&pTVar43->posFrames);
        if (!bVar12) goto LAB_007a9c8f;
      }
      else {
LAB_007a9c8f:
        this_05 = (aiNodeAnim *)operator_new(0x438);
        aiNodeAnim::aiNodeAnim(this_05);
        lVar4 = *(long *)it_1._M_current[6].name;
        uVar15 = *(uint *)((long)&it_1._M_current[5].comment.field_2 + 8);
        *(uint *)((long)&it_1._M_current[5].comment.field_2 + 8) = uVar15 + 1;
        *(aiNodeAnim **)(lVar4 + (ulong)uVar15 * 8) = this_05;
        rot._M_current = (TempKeyFrame *)this_05;
        pTVar43 = __gnu_cxx::
                  __normal_iterator<const_Assimp::MS3DImporter::TempJoint_*,_std::vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>_>
                  ::operator*(&local_18b8);
        aiString::Set((aiString *)this_05,pTVar43->name);
        pTVar43 = __gnu_cxx::
                  __normal_iterator<const_Assimp::MS3DImporter::TempJoint_*,_std::vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>_>
                  ::operator*(&local_18b8);
        sVar22 = std::
                 vector<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
                 ::size(&pTVar43->rotFrames);
        if (sVar22 != 0) {
          pTVar43 = __gnu_cxx::
                    __normal_iterator<const_Assimp::MS3DImporter::TempJoint_*,_std::vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>_>
                    ::operator*(&local_18b8);
          sVar22 = std::
                   vector<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
                   ::size(&pTVar43->rotFrames);
          auVar9._8_8_ = 0;
          auVar9._0_8_ = sVar22;
          uVar26 = SUB168(auVar9 * ZEXT816(0x18),0);
          if (SUB168(auVar9 * ZEXT816(0x18),8) != 0) {
            uVar26 = 0xffffffffffffffff;
          }
          paVar44 = (aiQuatKey *)operator_new__(uVar26);
          if (sVar22 != 0) {
            local_1de8 = paVar44;
            do {
              aiQuatKey::aiQuatKey(local_1de8);
              local_1de8 = local_1de8 + 1;
            } while (local_1de8 != paVar44 + sVar22);
          }
          *(aiQuatKey **)&rot._M_current[0x41].value.y = paVar44;
          pTVar43 = __gnu_cxx::
                    __normal_iterator<const_Assimp::MS3DImporter::TempJoint_*,_std::vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>_>
                    ::operator*(&local_18b8);
          local_18d8._M_current =
               (TempKeyFrame *)
               std::
               vector<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
               ::begin(&pTVar43->rotFrames);
          while( true ) {
            pTVar43 = __gnu_cxx::
                      __normal_iterator<const_Assimp::MS3DImporter::TempJoint_*,_std::vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>_>
                      ::operator*(&local_18b8);
            q = (aiQuatKey *)
                std::
                vector<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
                ::end(&pTVar43->rotFrames);
            bVar12 = __gnu_cxx::operator!=
                               (&local_18d8,
                                (__normal_iterator<const_Assimp::MS3DImporter::TempKeyFrame_*,_std::vector<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>_>
                                 *)&q);
            if (!bVar12) break;
            lVar4 = *(long *)&rot._M_current[0x41].value.y;
            fVar3 = rot._M_current[0x41].time;
            rot._M_current[0x41].time = (float)((int)fVar3 + 1);
            local_18e8 = (double *)(lVar4 + (ulong)(uint)fVar3 * 0x18);
            pTVar46 = __gnu_cxx::
                      __normal_iterator<const_Assimp::MS3DImporter::TempKeyFrame_*,_std::vector<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>_>
                      ::operator*(&local_18d8);
            *local_18e8 = (double)(pTVar46->time * (float)totalframes);
            aiMatrix4x4t<float>::aiMatrix4x4t(&local_199c);
            pTVar43 = __gnu_cxx::
                      __normal_iterator<const_Assimp::MS3DImporter::TempJoint_*,_std::vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>_>
                      ::operator*(&local_18b8);
            this_06 = aiMatrix4x4t<float>::FromEulerAnglesXYZ(&local_199c,&pTVar43->rotation);
            aiMatrix4x4t<float>::aiMatrix4x4t((aiMatrix4x4t<float> *)((long)&qu + 4));
            pTVar46 = __gnu_cxx::
                      __normal_iterator<const_Assimp::MS3DImporter::TempKeyFrame_*,_std::vector<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>_>
                      ::operator*(&local_18d8);
            m_00 = aiMatrix4x4t<float>::FromEulerAnglesXYZ
                             ((aiMatrix4x4t<float> *)((long)&qu + 4),&pTVar46->value);
            aiMatrix4x4t<float>::operator*(&local_195c,this_06,m_00);
            aiMatrix3x3t<float>::aiMatrix3x3t(&local_191c,&local_195c);
            aiQuaterniont<float>::aiQuaterniont((aiQuaterniont<float> *)&local_18f8,&local_191c);
            local_18e8[1] = local_18f8;
            local_18e8[2] = local_18f0;
            __gnu_cxx::
            __normal_iterator<const_Assimp::MS3DImporter::TempKeyFrame_*,_std::vector<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>_>
            ::operator++(&local_18d8);
          }
        }
        pTVar43 = __gnu_cxx::
                  __normal_iterator<const_Assimp::MS3DImporter::TempJoint_*,_std::vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>_>
                  ::operator*(&local_18b8);
        sVar22 = std::
                 vector<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
                 ::size(&pTVar43->posFrames);
        if (sVar22 != 0) {
          pTVar43 = __gnu_cxx::
                    __normal_iterator<const_Assimp::MS3DImporter::TempJoint_*,_std::vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>_>
                    ::operator*(&local_18b8);
          sVar22 = std::
                   vector<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
                   ::size(&pTVar43->posFrames);
          auVar10._8_8_ = 0;
          auVar10._0_8_ = sVar22;
          uVar26 = SUB168(auVar10 * ZEXT816(0x18),0);
          if (SUB168(auVar10 * ZEXT816(0x18),8) != 0) {
            uVar26 = 0xffffffffffffffff;
          }
          paVar45 = (aiVectorKey *)operator_new__(uVar26);
          if (sVar22 != 0) {
            local_1e30 = paVar45;
            do {
              aiVectorKey::aiVectorKey(local_1e30);
              local_1e30 = local_1e30 + 1;
            } while (local_1e30 != paVar45 + sVar22);
          }
          *(aiVectorKey **)&rot._M_current[0x40].value.y = paVar45;
          pos._M_current = *(TempKeyFrame **)&rot._M_current[0x41].value.y;
          pTVar43 = __gnu_cxx::
                    __normal_iterator<const_Assimp::MS3DImporter::TempJoint_*,_std::vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>_>
                    ::operator*(&local_18b8);
          local_19f0._M_current =
               (TempKeyFrame *)
               std::
               vector<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
               ::begin(&pTVar43->posFrames);
          while( true ) {
            pTVar43 = __gnu_cxx::
                      __normal_iterator<const_Assimp::MS3DImporter::TempJoint_*,_std::vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>_>
                      ::operator*(&local_18b8);
            v_4 = (aiVectorKey *)
                  std::
                  vector<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
                  ::end(&pTVar43->posFrames);
            bVar12 = __gnu_cxx::operator!=
                               (&local_19f0,
                                (__normal_iterator<const_Assimp::MS3DImporter::TempKeyFrame_*,_std::vector<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>_>
                                 *)&v_4);
            if (!bVar12) break;
            lVar4 = *(long *)&rot._M_current[0x40].value.y;
            fVar3 = rot._M_current[0x40].value.x;
            rot._M_current[0x40].value.x = (float)((int)fVar3 + 1);
            pdVar1 = (double *)(lVar4 + (ulong)(uint)fVar3 * 0x18);
            pTVar46 = __gnu_cxx::
                      __normal_iterator<const_Assimp::MS3DImporter::TempKeyFrame_*,_std::vector<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>_>
                      ::operator*(&local_19f0);
            *pdVar1 = (double)(pTVar46->time * (float)totalframes);
            pTVar43 = __gnu_cxx::
                      __normal_iterator<const_Assimp::MS3DImporter::TempJoint_*,_std::vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>_>
                      ::operator*(&local_18b8);
            pTVar46 = __gnu_cxx::
                      __normal_iterator<const_Assimp::MS3DImporter::TempKeyFrame_*,_std::vector<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>_>
                      ::operator*(&local_19f0);
            aVar48 = ::operator+(&pTVar43->position,&pTVar46->value);
            pdVar1[1] = aVar48._0_8_;
            *(float *)(pdVar1 + 2) = aVar48.z;
            __gnu_cxx::
            __normal_iterator<const_Assimp::MS3DImporter::TempKeyFrame_*,_std::vector<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>_>
            ::operator++(&local_19f0);
            pos._M_current = (TempKeyFrame *)&pos._M_current[1].value.y;
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<const_Assimp::MS3DImporter::TempJoint_*,_std::vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>_>
      ::operator++(&local_18b8);
    }
    if (*(int *)((long)&it_1._M_current[5].comment.field_2 + 8) == 0) {
      it_1._M_current[6].name[0] = '\0';
      it_1._M_current[6].name[1] = '\0';
      it_1._M_current[6].name[2] = '\0';
      it_1._M_current[6].name[3] = '\0';
      it_1._M_current[6].name[4] = '\0';
      it_1._M_current[6].name[5] = '\0';
      it_1._M_current[6].name[6] = '\0';
      it_1._M_current[6].name[7] = '\0';
    }
  }
  std::vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>::
  ~vector((vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
           *)&i_9);
  std::
  vector<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>::
  ~vector((vector<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
           *)&i_8);
  std::vector<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_>::
  ~vector((vector<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_>
           *)&i_6);
  std::
  vector<Assimp::MS3DImporter::TempTriangle,_std::allocator<Assimp::MS3DImporter::TempTriangle>_>::
  ~vector((vector<Assimp::MS3DImporter::TempTriangle,_std::allocator<Assimp::MS3DImporter::TempTriangle>_>
           *)&i_1);
  std::vector<Assimp::MS3DImporter::TempVertex,_std::allocator<Assimp::MS3DImporter::TempVertex>_>::
  ~vector((vector<Assimp::MS3DImporter::TempVertex,_std::allocator<Assimp::MS3DImporter::TempVertex>_>
           *)&i);
  StreamReader<false,_false>::~StreamReader((StreamReader<false,_false> *)local_60);
  return;
}

Assistant:

void MS3DImporter::InternReadFile( const std::string& pFile,
    aiScene* pScene, IOSystem* pIOHandler)
{
    StreamReaderLE stream(pIOHandler->Open(pFile,"rb"));

    // CanRead() should have done this already
    char head[10];
    int32_t version;

    mScene = pScene;


    // 1 ------------ read into temporary data structures mirroring the original file

    stream.CopyAndAdvance(head,10);
    stream >> version;
    if (strncmp(head,"MS3D000000",10)) {
        throw DeadlyImportError("Not a MS3D file, magic string MS3D000000 not found: "+pFile);
    }

    if (version != 4) {
        throw DeadlyImportError("MS3D: Unsupported file format version, 4 was expected");
    }

    uint16_t verts;
    stream >> verts;

    std::vector<TempVertex> vertices(verts);
    for (unsigned int i = 0; i < verts; ++i) {
        TempVertex& v = vertices[i];

        stream.IncPtr(1);
        ReadVector(stream,v.pos);
        v.bone_id[0] = stream.GetI1();
        v.ref_cnt = stream.GetI1();

        v.bone_id[1] = v.bone_id[2] = v.bone_id[3] = UINT_MAX;
        v.weights[1] = v.weights[2] = v.weights[3] = 0.f;
        v.weights[0] = 1.f;
    }

    uint16_t tris;
    stream >> tris;

    std::vector<TempTriangle> triangles(tris);
    for (unsigned int i = 0;i < tris; ++i) {
        TempTriangle& t = triangles[i];

        stream.IncPtr(2);
        for (unsigned int i = 0; i < 3; ++i) {
            t.indices[i] = stream.GetI2();
        }

        for (unsigned int i = 0; i < 3; ++i) {
            ReadVector(stream,t.normals[i]);
        }

        for (unsigned int i = 0; i < 3; ++i) {
            stream >> (float&)(t.uv[i].x); // see note in ReadColor()
        }
        for (unsigned int i = 0; i < 3; ++i) {
            stream >> (float&)(t.uv[i].y);
        }

        t.sg    = stream.GetI1();
        t.group = stream.GetI1();
    }

    uint16_t grp;
    stream >> grp;

    bool need_default = false;
    std::vector<TempGroup> groups(grp);
    for (unsigned int i = 0;i < grp; ++i) {
        TempGroup& t = groups[i];

        stream.IncPtr(1);
        stream.CopyAndAdvance(t.name,32);

        t.name[32] = '\0';
        uint16_t num;
        stream >> num;

        t.triangles.resize(num);
        for (unsigned int i = 0; i < num; ++i) {
            t.triangles[i] = stream.GetI2();
        }
        t.mat = stream.GetI1();
        if (t.mat == UINT_MAX) {
            need_default = true;
        }
    }

    uint16_t mat;
    stream >> mat;

    std::vector<TempMaterial> materials(mat);
    for (unsigned int i = 0;i < mat; ++i) {
        TempMaterial& t = materials[i];

        stream.CopyAndAdvance(t.name,32);
        t.name[32] = '\0';

        ReadColor(stream,t.ambient);
        ReadColor(stream,t.diffuse);
        ReadColor(stream,t.specular);
        ReadColor(stream,t.emissive);
        stream >> t.shininess  >> t.transparency;

        stream.IncPtr(1);

        stream.CopyAndAdvance(t.texture,128);
        t.texture[128] = '\0';

        stream.CopyAndAdvance(t.alphamap,128);
        t.alphamap[128] = '\0';
    }

    float animfps, currenttime;
    uint32_t totalframes;
    stream >> animfps >> currenttime >> totalframes;

    uint16_t joint;
    stream >> joint;

    std::vector<TempJoint> joints(joint);
    for(unsigned int i = 0; i < joint; ++i) {
        TempJoint& j = joints[i];

        stream.IncPtr(1);
        stream.CopyAndAdvance(j.name,32);
        j.name[32] = '\0';

        stream.CopyAndAdvance(j.parentName,32);
        j.parentName[32] = '\0';

        ReadVector(stream,j.rotation);
        ReadVector(stream,j.position);

        j.rotFrames.resize(stream.GetI2());
        j.posFrames.resize(stream.GetI2());

        for(unsigned int a = 0; a < j.rotFrames.size(); ++a) {
            TempKeyFrame& kf = j.rotFrames[a];
            stream >> kf.time;
            ReadVector(stream,kf.value);
        }
        for(unsigned int a = 0; a < j.posFrames.size(); ++a) {
            TempKeyFrame& kf = j.posFrames[a];
            stream >> kf.time;
            ReadVector(stream,kf.value);
        }
    }

    if(stream.GetRemainingSize() > 4) {
        uint32_t subversion;
        stream >> subversion;
        if (subversion == 1) {
            ReadComments<TempGroup>(stream,groups);
            ReadComments<TempMaterial>(stream,materials);
            ReadComments<TempJoint>(stream,joints);

            // model comment - print it for we have such a nice log.
            if (stream.GetI4()) {
                const size_t len = static_cast<size_t>(stream.GetI4());
                if (len > stream.GetRemainingSize()) {
                    throw DeadlyImportError("MS3D: Model comment is too long");
                }

                const std::string& s = std::string(reinterpret_cast<char*>(stream.GetPtr()),len);
                ASSIMP_LOG_DEBUG_F("MS3D: Model comment: ", s);
            }

            if(stream.GetRemainingSize() > 4 && inrange((stream >> subversion,subversion),1u,3u)) {
                for(unsigned int i = 0; i < verts; ++i) {
                    TempVertex& v = vertices[i];
                    v.weights[3]=1.f;
                    for(unsigned int n = 0; n < 3; v.weights[3]-=v.weights[n++]) {
                        v.bone_id[n+1] = stream.GetI1();
                        v.weights[n] = static_cast<float>(static_cast<unsigned int>(stream.GetI1()))/255.f;
                    }
                    stream.IncPtr((subversion-1)<<2u);
                }

                // even further extra data is not of interest for us, at least now now.
            }
        }
    }

    // 2 ------------ convert to proper aiXX data structures -----------------------------------

    if (need_default && materials.size()) {
        ASSIMP_LOG_WARN("MS3D: Found group with no material assigned, spawning default material");
        // if one of the groups has no material assigned, but there are other
        // groups with materials, a default material needs to be added (
        // scenepreprocessor adds a default material only if nummat==0).
        materials.push_back(TempMaterial());
        TempMaterial& m = materials.back();

        strcpy(m.name,"<MS3D_DefaultMat>");
        m.diffuse = aiColor4D(0.6f,0.6f,0.6f,1.0);
        m.transparency = 1.f;
        m.shininess = 0.f;

        // this is because these TempXXX struct's have no c'tors.
        m.texture[0] = m.alphamap[0] = '\0';

        for (unsigned int i = 0; i < groups.size(); ++i) {
            TempGroup& g = groups[i];
            if (g.mat == UINT_MAX) {
                g.mat = static_cast<unsigned int>(materials.size()-1);
            }
        }
    }

    // convert materials to our generic key-value dict-alike
    if (materials.size()) {
        pScene->mMaterials = new aiMaterial*[materials.size()];
        for (size_t i = 0; i < materials.size(); ++i) {

            aiMaterial* mo = new aiMaterial();
            pScene->mMaterials[pScene->mNumMaterials++] = mo;

            const TempMaterial& mi = materials[i];

            aiString tmp;
            if (0[mi.alphamap]) {
                tmp = aiString(mi.alphamap);
                mo->AddProperty(&tmp,AI_MATKEY_TEXTURE_OPACITY(0));
            }
            if (0[mi.texture]) {
                tmp = aiString(mi.texture);
                mo->AddProperty(&tmp,AI_MATKEY_TEXTURE_DIFFUSE(0));
            }
            if (0[mi.name]) {
                tmp = aiString(mi.name);
                mo->AddProperty(&tmp,AI_MATKEY_NAME);
            }

            mo->AddProperty(&mi.ambient,1,AI_MATKEY_COLOR_AMBIENT);
            mo->AddProperty(&mi.diffuse,1,AI_MATKEY_COLOR_DIFFUSE);
            mo->AddProperty(&mi.specular,1,AI_MATKEY_COLOR_SPECULAR);
            mo->AddProperty(&mi.emissive,1,AI_MATKEY_COLOR_EMISSIVE);

            mo->AddProperty(&mi.shininess,1,AI_MATKEY_SHININESS);
            mo->AddProperty(&mi.transparency,1,AI_MATKEY_OPACITY);

            const int sm = mi.shininess>0.f?aiShadingMode_Phong:aiShadingMode_Gouraud;
            mo->AddProperty(&sm,1,AI_MATKEY_SHADING_MODEL);
        }
    }

    // convert groups to meshes
    if (groups.empty()) {
        throw DeadlyImportError("MS3D: Didn't get any group records, file is malformed");
    }

    pScene->mMeshes = new aiMesh*[pScene->mNumMeshes=static_cast<unsigned int>(groups.size())]();
    for (unsigned int i = 0; i < pScene->mNumMeshes; ++i) {

        aiMesh* m = pScene->mMeshes[i] = new aiMesh();
        const TempGroup& g = groups[i];

        if (pScene->mNumMaterials && g.mat > pScene->mNumMaterials) {
            throw DeadlyImportError("MS3D: Encountered invalid material index, file is malformed");
        } // no error if no materials at all - scenepreprocessor adds one then

        m->mMaterialIndex  = g.mat;
        m->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;

        m->mFaces = new aiFace[m->mNumFaces = static_cast<unsigned int>(g.triangles.size())];
        m->mNumVertices = m->mNumFaces*3;

        // storage for vertices - verbose format, as requested by the postprocessing pipeline
        m->mVertices = new aiVector3D[m->mNumVertices];
        m->mNormals  = new aiVector3D[m->mNumVertices];
        m->mTextureCoords[0] = new aiVector3D[m->mNumVertices];
        m->mNumUVComponents[0] = 2;

        typedef std::map<unsigned int,unsigned int> BoneSet;
        BoneSet mybones;

        for (unsigned int i = 0,n = 0; i < m->mNumFaces; ++i) {
            aiFace& f = m->mFaces[i];
            if (g.triangles[i]>triangles.size()) {
                throw DeadlyImportError("MS3D: Encountered invalid triangle index, file is malformed");
            }

            TempTriangle& t = triangles[g.triangles[i]];
            f.mIndices = new unsigned int[f.mNumIndices=3];

            for (unsigned int i = 0; i < 3; ++i,++n) {
                if (t.indices[i]>vertices.size()) {
                    throw DeadlyImportError("MS3D: Encountered invalid vertex index, file is malformed");
                }

                const TempVertex& v = vertices[t.indices[i]];
                for(unsigned int a = 0; a < 4; ++a) {
                    if (v.bone_id[a] != UINT_MAX) {
                        if (v.bone_id[a] >= joints.size()) {
                            throw DeadlyImportError("MS3D: Encountered invalid bone index, file is malformed");
                        }
                        if (mybones.find(v.bone_id[a]) == mybones.end()) {
                             mybones[v.bone_id[a]] = 1;
                        }
                        else ++mybones[v.bone_id[a]];
                    }
                }

                // collect vertex components
                m->mVertices[n] = v.pos;

                m->mNormals[n] = t.normals[i];
                m->mTextureCoords[0][n] = aiVector3D(t.uv[i].x,1.f-t.uv[i].y,0.0);
                f.mIndices[i] = n;
            }
        }

        // allocate storage for bones
        if(!mybones.empty()) {
            std::vector<unsigned int> bmap(joints.size());
            m->mBones = new aiBone*[mybones.size()]();
            for(BoneSet::const_iterator it = mybones.begin(); it != mybones.end(); ++it) {
                aiBone* const bn = m->mBones[m->mNumBones] = new aiBone();
                const TempJoint& jnt = joints[(*it).first];

                bn->mName.Set(jnt.name);
                bn->mWeights = new aiVertexWeight[(*it).second];

                bmap[(*it).first] = m->mNumBones++;
            }

            // .. and collect bone weights
            for (unsigned int i = 0,n = 0; i < m->mNumFaces; ++i) {
                TempTriangle& t = triangles[g.triangles[i]];

                for (unsigned int i = 0; i < 3; ++i,++n) {
                    const TempVertex& v = vertices[t.indices[i]];
                    for(unsigned int a = 0; a < 4; ++a) {
                        const unsigned int bone = v.bone_id[a];
                        if(bone==UINT_MAX){
                            continue;
                        }

                        aiBone* const outbone = m->mBones[bmap[bone]];
                        aiVertexWeight& outwght = outbone->mWeights[outbone->mNumWeights++];

                        outwght.mVertexId = n;
                        outwght.mWeight = v.weights[a];
                    }
                }
            }
        }
    }

    // ... add dummy nodes under a single root, each holding a reference to one
    // mesh. If we didn't do this, we'd lose the group name.
    aiNode* rt = pScene->mRootNode = new aiNode("<MS3DRoot>");

#ifdef ASSIMP_BUILD_MS3D_ONE_NODE_PER_MESH
    rt->mChildren = new aiNode*[rt->mNumChildren=pScene->mNumMeshes+(joints.size()?1:0)]();

    for (unsigned int i = 0; i < pScene->mNumMeshes; ++i) {
        aiNode* nd = rt->mChildren[i] = new aiNode();

        const TempGroup& g = groups[i];

        // we need to generate an unique name for all mesh nodes.
        // since we want to keep the group name, a prefix is
        // prepended.
        nd->mName = aiString("<MS3DMesh>_");
        nd->mName.Append(g.name);
        nd->mParent = rt;

        nd->mMeshes = new unsigned int[nd->mNumMeshes = 1];
        nd->mMeshes[0] = i;
    }
#else
    rt->mMeshes = new unsigned int[pScene->mNumMeshes];
    for (unsigned int i = 0; i < pScene->mNumMeshes; ++i) {
        rt->mMeshes[rt->mNumMeshes++] = i;
    }
#endif

    // convert animations as well
    if(joints.size()) {
#ifndef ASSIMP_BUILD_MS3D_ONE_NODE_PER_MESH
        rt->mChildren = new aiNode*[1]();
        rt->mNumChildren = 1;

        aiNode* jt = rt->mChildren[0] = new aiNode();
#else
        aiNode* jt = rt->mChildren[pScene->mNumMeshes] = new aiNode();
#endif
        jt->mParent = rt;
        CollectChildJoints(joints,jt);
        jt->mName.Set("<MS3DJointRoot>");

        pScene->mAnimations = new aiAnimation*[ pScene->mNumAnimations = 1 ];
        aiAnimation* const anim = pScene->mAnimations[0] = new aiAnimation();

        anim->mName.Set("<MS3DMasterAnim>");

        // carry the fps info to the user by scaling all times with it
        anim->mTicksPerSecond = animfps;

        // leave duration at its default, so ScenePreprocessor will fill an appropriate
        // value (the values taken from some MS3D files seem to be too unreliable
        // to pass the validation)
        // anim->mDuration = totalframes/animfps;

        anim->mChannels = new aiNodeAnim*[joints.size()]();
        for(std::vector<TempJoint>::const_iterator it = joints.begin(); it != joints.end(); ++it) {
            if ((*it).rotFrames.empty() && (*it).posFrames.empty()) {
                continue;
            }

            aiNodeAnim* nd = anim->mChannels[anim->mNumChannels++] = new aiNodeAnim();
            nd->mNodeName.Set((*it).name);

            if ((*it).rotFrames.size()) {
                nd->mRotationKeys = new aiQuatKey[(*it).rotFrames.size()];
                for(std::vector<TempKeyFrame>::const_iterator rot = (*it).rotFrames.begin(); rot != (*it).rotFrames.end(); ++rot) {
                    aiQuatKey& q = nd->mRotationKeys[nd->mNumRotationKeys++];

                    q.mTime = (*rot).time*animfps;
                    q.mValue = aiQuaternion(aiMatrix3x3(aiMatrix4x4().FromEulerAnglesXYZ((*it).rotation)*
                        aiMatrix4x4().FromEulerAnglesXYZ((*rot).value)));
                }
            }

            if ((*it).posFrames.size()) {
                nd->mPositionKeys = new aiVectorKey[(*it).posFrames.size()];

                aiQuatKey* qu = nd->mRotationKeys;
                for(std::vector<TempKeyFrame>::const_iterator pos = (*it).posFrames.begin(); pos != (*it).posFrames.end(); ++pos,++qu) {
                    aiVectorKey& v = nd->mPositionKeys[nd->mNumPositionKeys++];

                    v.mTime = (*pos).time*animfps;
                    v.mValue = (*it).position + (*pos).value;
                }
            }
        }
        // fixup to pass the validation if not a single animation channel is non-trivial
        if (!anim->mNumChannels) {
            anim->mChannels = NULL;
        }
    }
}